

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_encoder.hpp
# Opt level: O3

bool __thiscall
jsoncons::basic_compact_json_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>::
visit_uint64(basic_compact_json_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>
             *this,uint64_t value,semantic_tag param_2,ser_context *param_3,error_code *param_4)

{
  size_t *psVar1;
  pointer peVar2;
  
  peVar2 = (this->stack_).
           super__Vector_base<jsoncons::basic_compact_json_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>::encoding_context,_std::allocator<jsoncons::basic_compact_json_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>::encoding_context>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if ((((this->stack_).
        super__Vector_base<jsoncons::basic_compact_json_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>::encoding_context,_std::allocator<jsoncons::basic_compact_json_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>::encoding_context>_>
        ._M_impl.super__Vector_impl_data._M_start != peVar2) && (peVar2[-1].type_ == array)) &&
     (peVar2[-1].count_ != 0)) {
    stream_sink<char>::push_back(&this->sink_,',');
  }
  detail::from_integer<unsigned_long,jsoncons::stream_sink<char>>(value,&this->sink_);
  peVar2 = (this->stack_).
           super__Vector_base<jsoncons::basic_compact_json_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>::encoding_context,_std::allocator<jsoncons::basic_compact_json_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>::encoding_context>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if ((this->stack_).
      super__Vector_base<jsoncons::basic_compact_json_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>::encoding_context,_std::allocator<jsoncons::basic_compact_json_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>::encoding_context>_>
      ._M_impl.super__Vector_impl_data._M_start != peVar2) {
    psVar1 = &peVar2[-1].count_;
    *psVar1 = *psVar1 + 1;
  }
  return true;
}

Assistant:

JSONCONS_VISITOR_RETURN_TYPE visit_uint64(uint64_t value, 
                             semantic_tag, 
                             const ser_context&,
                             std::error_code&) final
        {
            if (!stack_.empty() && stack_.back().is_array() && stack_.back().count() > 0)
            {
                sink_.push_back(',');
            }
            jsoncons::detail::from_integer(value, sink_);
            if (!stack_.empty())
            {
                stack_.back().increment_count();
            }
            JSONCONS_VISITOR_RETURN;
        }